

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall GraphBuilder::getJoins(GraphBuilder *this)

{
  bool bVar1;
  reference pvVar2;
  long in_RSI;
  unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::CallInst_*>,_bool> pVar3;
  value_type iterator;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
  *__range1;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *llvmJoins;
  unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
  *this_00;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false> local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  ::set((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
         *)0x193aee);
  local_20 = in_RSI + 0xe8;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
       ::begin(in_RDI);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
       ::end(in_RDI);
  while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>
             ::operator*((_Node_const_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>
                          *)0x193b3b);
    pVar3 = std::
            set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
            ::insert((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
                      *)pvVar2->first,
                     (value_type *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffb8 = pVar3.second;
    std::__detail::
    _Node_const_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false,_false>
                *)this_00);
  }
  return (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
          *)this_00;
}

Assistant:

std::set<const CallInst *> GraphBuilder::getJoins() const {
    std::set<const CallInst *> llvmJoins;
    for (auto iterator : llvmToJoins_) {
        llvmJoins.insert(iterator.first);
    }
    return llvmJoins;
}